

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_7,_8>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  int i;
  bool bVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  undefined1 auVar6 [16];
  bool bVar8;
  float fVar9;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Mat3x2 m;
  Type in0;
  float afStack_e8 [6];
  float local_d0 [2];
  undefined8 local_c8;
  undefined4 local_c0;
  Matrix<float,_2,_3> local_b8;
  undefined8 local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined4 local_70;
  Matrix<float,_4,_2> local_68;
  undefined8 local_40;
  undefined4 local_38;
  undefined8 local_2c;
  undefined4 local_24;
  undefined4 local_20;
  undefined8 local_18;
  long lVar7;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_68.m_data.m_data[0].m_data = *&evalCtx->in[0].m_data;
    local_68.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_68.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    local_68.m_data.m_data[0].m_data[2] = -0.2;
    local_68.m_data.m_data[0].m_data[3] = -0.1;
    local_68.m_data.m_data[0].m_data[0] = -0.6;
    local_68.m_data.m_data[0].m_data[1] = -0.6;
    local_68.m_data.m_data[1].m_data[0] = -1.1;
    local_68.m_data.m_data[1].m_data[1] = -0.6;
    local_68.m_data.m_data[1].m_data[2] = -0.6;
    local_68.m_data.m_data[1].m_data[3] = -0.1;
  }
  pfVar1 = local_b8.m_data.m_data[0].m_data + 1;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    pfVar4 = (float *)&local_b8;
    bVar8 = true;
    do {
      bVar2 = bVar8;
      lVar5 = 0;
      auVar6 = _DAT_00ac4b30;
      do {
        bVar8 = SUB164(auVar6 ^ _DAT_00ac4b80,4) == -0x80000000 &&
                SUB164(auVar6 ^ _DAT_00ac4b80,0) < -0x7ffffffd;
        if (bVar8) {
          fVar9 = 1.0;
          if (lVar3 != lVar5) {
            fVar9 = 0.0;
          }
          pfVar4[lVar5 * 2] = fVar9;
        }
        if (bVar8) {
          fVar9 = 1.0;
          if (lVar3 + -1 != lVar5) {
            fVar9 = 0.0;
          }
          pfVar4[(lVar5 + 1) * 2] = fVar9;
        }
        lVar5 = lVar5 + 2;
        lVar7 = auVar6._8_8_;
        auVar6._0_8_ = auVar6._0_8_ + 2;
        auVar6._8_8_ = lVar7 + 2;
      } while (lVar5 != 4);
      lVar3 = 1;
      pfVar4 = pfVar1;
      bVar8 = false;
    } while (bVar2);
    local_b8.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_b8.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_b8.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    local_b8.m_data.m_data[0].m_data[0] = 0.0;
    local_b8.m_data.m_data[0].m_data[1] = 0.0;
    local_b8.m_data.m_data[1].m_data[0] = 0.0;
    local_b8.m_data.m_data[1].m_data[1] = 0.0;
    local_b8.m_data.m_data[2].m_data[0] = 0.0;
    local_b8.m_data.m_data[2].m_data[1] = 0.0;
    lVar3 = 0;
    pfVar4 = (float *)&local_b8;
    bVar8 = true;
    do {
      bVar2 = bVar8;
      lVar5 = 0;
      do {
        pfVar4[lVar5 * 2] = *(float *)((long)&DAT_00b1f938 + lVar5 * 4 + lVar3);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar3 = 0xc;
      pfVar4 = pfVar1;
      bVar8 = false;
    } while (bVar2);
  }
  tcu::operator*(&local_68,&local_b8);
  local_78 = local_40;
  local_70 = local_38;
  local_88 = local_2c;
  local_80 = local_24;
  local_d0[0] = 0.0;
  local_d0[1] = 0.0;
  local_c8 = (ulong)local_c8._4_4_ << 0x20;
  lVar3 = 0;
  do {
    local_d0[lVar3] =
         *(float *)((long)&local_78 + lVar3 * 4) + *(float *)((long)&local_88 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_98 = local_18;
  local_90 = local_20;
  afStack_e8[2] = 0.0;
  afStack_e8[3] = 0.0;
  afStack_e8[4] = 0.0;
  lVar3 = 0;
  do {
    afStack_e8[lVar3 + 2] = local_d0[lVar3] + *(float *)((long)&local_98 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_c8 = 0x100000000;
  local_c0 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_d0[lVar3]] = afStack_e8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}